

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

void __thiscall CJSON::AddPair<unsigned_long>(CJSON *this,string *Name,unsigned_long *val)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  iterator iVar3;
  mapped_type *this_00;
  CJSONException *this_01;
  long *plVar4;
  ulong uVar5;
  size_type *psVar6;
  char cVar7;
  string __str;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,Name);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->m_Values)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (CJSONException *)__cxa_allocate_exception(0x30);
    std::operator+(&local_50,"Name \'",Name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
      local_70.field_2._M_allocated_capacity = *psVar6;
      local_70.field_2._8_8_ = plVar4[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar6;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    CJSONException::CJSONException(this_01,&local_70,NAME_ALREADY_EXITS);
    __cxa_throw(this_01,&CJSONException::typeinfo,CJSONException::~CJSONException);
  }
  __val = *val;
  cVar7 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar2 = '\x04';
    do {
      cVar7 = cVar2;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_00120958;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_00120958;
      }
      if (uVar5 < 10000) goto LAB_00120958;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar2 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_00120958:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,__val);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_Values,Name);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void AddPair(const std::string &Name, const T &val)
        {
            if(m_Values.find(Name) != m_Values.end())
                throw CJSONException("Name '" + Name + "' already exists!", JSONErrorType::NAME_ALREADY_EXITS);

            m_Values[Name] = ValueToString(val); 
        }